

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O3

RtMidiOutPtr rtmidi_out_create(RtMidiApi api,char *clientName)

{
  RtMidiOutPtr pRVar1;
  RtMidiOut *this;
  string name;
  allocator<char> local_49;
  string local_48;
  
  pRVar1 = (RtMidiOutPtr)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,clientName,&local_49);
  this = (RtMidiOut *)operator_new(0x10);
  RtMidiOut::RtMidiOut(this,api,&local_48);
  pRVar1->ptr = this;
  pRVar1->data = (void *)0x0;
  pRVar1->ok = true;
  pRVar1->msg = "";
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pRVar1;
}

Assistant:

RtMidiOutPtr rtmidi_out_create (enum RtMidiApi api, const char *clientName)
{
    RtMidiWrapper* wrp = new RtMidiWrapper;
    std::string name = clientName;

    try {
        RtMidiOut* rOut = new RtMidiOut ((RtMidi::Api) api, name);

        wrp->ptr = (void*) rOut;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }


    return wrp;
}